

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::pmin(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  BasicType BVar1;
  int32_t iVar2;
  Literal local_40;
  
  BVar1 = wasm::Type::getBasic(&this->type);
  if ((BVar1 & ~unreachable) == f32) {
    lt(&local_40,other,this);
    iVar2 = geti32(&local_40);
    if (iVar2 == 0) {
      other = this;
    }
    Literal(__return_storage_ptr__,other);
    ~Literal(&local_40);
    return __return_storage_ptr__;
  }
  handle_unreachable("unexpected type",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                     ,0x60d);
}

Assistant:

Literal Literal::pmin(const Literal& other) const {
  switch (type.getBasic()) {
    case Type::f32:
    case Type::f64:
      return other.lt(*this).geti32() ? other : *this;
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}